

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_ThrustThing(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  AActor *it_00;
  TAngle<double> local_50;
  TAngle<double> local_48;
  undefined1 local_40 [8];
  FActorIterator iterator;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  iterator.id = arg2;
  iterator._12_4_ = arg1;
  if (arg3 == 0) {
    if (it == (AActor *)0x0) {
      ln_local._4_4_ = 0;
    }
    else if (((level.flags2 & 0x800000) == 0) || (!backSide)) {
      TAngle<double>::TAngle(&local_50,(double)arg0 * 1.40625);
      ThrustThingHelper(it,&local_50,(double)(int)iterator._12_4_,iterator.id);
      ln_local._4_4_ = 1;
    }
    else {
      ln_local._4_4_ = 0;
    }
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)local_40,arg3);
    while( true ) {
      it_00 = FActorIterator::Next((FActorIterator *)local_40);
      if (it_00 == (AActor *)0x0) break;
      TAngle<double>::TAngle(&local_48,(double)arg0 * 1.40625);
      ThrustThingHelper(it_00,&local_48,(double)(int)iterator._12_4_,iterator.id);
    }
    ln_local._4_4_ = 1;
  }
  return ln_local._4_4_;
}

Assistant:

FUNC(LS_ThrustThing)
// ThrustThing (angle, force, nolimit, tid)
{
	if (arg3 != 0)
	{
		FActorIterator iterator (arg3);
		while ((it = iterator.Next()) != NULL)
		{
			ThrustThingHelper (it, BYTEANGLE(arg0), arg1, arg2);
		}
		return true;
	}
	else if (it)
	{
		if (level.flags2 & LEVEL2_HEXENHACK && backSide)
		{
			return false;
		}
		ThrustThingHelper (it, BYTEANGLE(arg0), arg1, arg2);
		return true;
	}
	return false;
}